

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_transfer_object(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  CHAR_DATA *pCVar5;
  CHAR_DATA *in_RDX;
  __type_conflict2 _Var6;
  char arg2 [4608];
  char arg1 [4608];
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  char *in_stack_ffffffffffffdbb0;
  int in_stack_ffffffffffffdbb8;
  undefined4 in_stack_ffffffffffffdbbc;
  char *in_stack_ffffffffffffdbc0;
  char *format;
  char local_2438;
  OBJ_DATA *in_stack_ffffffffffffdbd0;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  char *in_stack_ffffffffffffedc0;
  char in_stack_ffffffffffffedc8;
  undefined7 in_stack_ffffffffffffedc9;
  char *in_stack_ffffffffffffffb0;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  
  target_name = one_argument(in_stack_ffffffffffffdbb0,(char *)in_stack_ffffffffffffdba8);
  one_argument(in_stack_ffffffffffffdbb0,(char *)in_stack_ffffffffffffdba8);
  if ((in_stack_ffffffffffffedc8 == '\0') || (local_2438 == '\0')) {
    send_to_char(in_stack_ffffffffffffdbc0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
  }
  else {
    pOVar4 = get_obj_carry((CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffedc9,in_stack_ffffffffffffedc8),
                           in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
    if (pOVar4 == (OBJ_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffdbc0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
    }
    else {
      pCVar5 = get_char_world(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      if (pCVar5 == (CHAR_DATA *)0x0) {
        send_to_char(in_stack_ffffffffffffdbc0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
      }
      else {
        bVar1 = is_npc(in_stack_ffffffffffffdba8);
        if (bVar1) {
          send_to_char(in_stack_ffffffffffffdbc0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
        }
        else if (pCVar5 == in_RDX) {
          send_to_char(in_stack_ffffffffffffdbc0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
        }
        else {
          bVar1 = is_immortal(in_stack_ffffffffffffdba8);
          if ((!bVar1) || (bVar1 = is_immortal(in_stack_ffffffffffffdba8), bVar1)) {
            format = (char *)pOVar4->extra_flags[0];
            _Var6 = std::pow<int,int>(0,0x620b2e);
            if (((ulong)format & (long)_Var6) == 0) {
              iVar2 = (int)pCVar5->carry_number;
              iVar3 = can_carry_n((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbb8));
              if (iVar2 < iVar3) {
                in_stack_ffffffffffffdbb8 = (int)pCVar5->carry_weight;
                iVar3 = can_carry_w((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbb8));
                if ((in_stack_ffffffffffffdbb8 < iVar3) && (bVar1 = isCabalItem(pOVar4), !bVar1)) {
                  pOVar4 = (OBJ_DATA *)pCVar5->act[0];
                  _Var6 = std::pow<int,int>(0,0x620c32);
                  if (((ulong)pOVar4 & (long)_Var6) != 0) {
                    send_to_char(format,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbb8));
                    return;
                  }
                  act(format,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbb8),pOVar4,
                      in_stack_ffffffffffffdba8,0);
                  act(format,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbb8),pOVar4,
                      in_stack_ffffffffffffdba8,0);
                  obj_from_char(in_stack_ffffffffffffdbd0);
                  obj_to_char(pOVar4,in_stack_ffffffffffffdba8);
                  act(format,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbb8),pOVar4,
                      in_stack_ffffffffffffdba8,0);
                  act(format,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbb8),pOVar4,
                      in_stack_ffffffffffffdba8,0);
                  return;
                }
              }
              act(format,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbb8),
                  in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,0);
              act(format,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbb8),
                  in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,0);
            }
            else {
              send_to_char(format,(CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
            }
          }
          else {
            send_to_char(in_stack_ffffffffffffdbc0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8))
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spell_transfer_object(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];

	target_name = one_argument(target_name, arg1);
	one_argument(target_name, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Send what to whom?\n\r", ch);
		return;
	}

	if ((obj = get_obj_carry(ch, arg1, ch)) == nullptr)
	{
		send_to_char("You are not carrying that.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg2);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("They wouldn't want that sent to them.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Why not just hold it in your other hand?\n\r", ch);
		return;
	}

	if (is_immortal(victim) && !is_immortal(ch))
	{
		send_to_char("You can't send to an immortal.\n\r", ch);
		return;
	}

	if (IS_SET(obj->extra_flags, ITEM_NODROP))
	{
		send_to_char("You can't seem to remove it from yourself to prepare for transfer.\n\r", ch);
		return;
	}

	if (victim->carry_number >= can_carry_n(victim)
		|| victim->carry_weight >= can_carry_w(victim)
		|| isCabalItem(obj))
	{
		act("$p glows softly but nothing happens.", ch, obj, 0, TO_CHAR);
		act("$p glows softly but nothing happens.", ch, obj, 0, TO_ROOM);
		return;
	}

	if (IS_SET(victim->act, PLR_NO_TRANSFER))
	{
		send_to_char("They wouldn't want them sent to them.\n\r", ch);
		return;
	}

	act("$p glows softly and vanishes!", ch, obj, 0, TO_CHAR);
	act("$p glows softly and vanishes!", ch, obj, 0, TO_ROOM);

	obj_from_char(obj);
	obj_to_char(obj, victim);

	act("You suddenly feel heavier as $p pops into your inventory!", victim, obj, 0, TO_CHAR);
	act("$p suddenly appears from nowhere and pops into $n's possession!", victim, obj, 0, TO_ROOM);
}